

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

char * __thiscall btSoftBody::serialize(btSoftBody *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  uint uVar2;
  Material *pMVar3;
  Node *pNVar4;
  Link *pLVar5;
  Face *pFVar6;
  Tetra *pTVar7;
  Anchor *pAVar8;
  float *pfVar9;
  Cluster *pCVar10;
  Joint **ppJVar11;
  Joint *pJVar12;
  int i_5;
  long lVar13;
  undefined8 uVar14;
  long lVar15;
  Anchor *pAVar16;
  btMatrix3x3 *pbVar17;
  int i_7;
  int iVar18;
  long lVar19;
  btTransform *pbVar20;
  btVector3 *pbVar21;
  int *piVar22;
  void *pvVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  int i_1;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined8 *puVar32;
  long lVar33;
  int i;
  btHashMap<btHashPtr,_int> m_nodeIndexMap;
  long local_f0;
  int local_dc;
  void *local_d8;
  long local_d0;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_c8;
  long local_c0;
  ulong local_b8;
  btHashMap<btHashPtr,_int> local_b0;
  
  btCollisionObject::serialize(&this->super_btCollisionObject,dataBuffer,serializer);
  local_b0.m_hashTable.m_ownsMemory = true;
  lVar13 = 0;
  local_b0.m_hashTable.m_data = (int *)0x0;
  local_b0.m_hashTable.m_size = 0;
  local_b0.m_hashTable.m_capacity = 0;
  local_b0.m_next.m_ownsMemory = true;
  local_b0.m_next.m_data = (int *)0x0;
  local_b0.m_next.m_size = 0;
  local_b0.m_next.m_capacity = 0;
  local_b0.m_valueArray.m_ownsMemory = true;
  local_b0.m_valueArray.m_data = (int *)0x0;
  local_b0.m_valueArray.m_size = 0;
  local_b0.m_valueArray.m_capacity = 0;
  local_b0.m_keyArray.m_ownsMemory = true;
  local_b0.m_keyArray.m_data = (btHashPtr *)0x0;
  local_b0.m_keyArray.m_size = 0;
  local_b0.m_keyArray.m_capacity = 0;
  iVar18 = (this->m_materials).m_size;
  *(int *)((long)dataBuffer + 0x158) = iVar18;
  if (iVar18 != 0) {
    lVar13 = (**(code **)(*(long *)serializer + 0x38))(serializer,&this->m_materials);
  }
  *(long *)((long)dataBuffer + 0x118) = lVar13;
  local_d8 = dataBuffer;
  if (lVar13 != 0) {
    uVar2 = *(uint *)((long)dataBuffer + 0x158);
    lVar13 = (**(code **)(*(long *)serializer + 0x20))(serializer,8,(ulong)uVar2);
    if (0 < (int)uVar2) {
      lVar19 = *(long *)(lVar13 + 8);
      uVar31 = 0;
      do {
        pMVar3 = (this->m_materials).m_data[uVar31];
        if (pMVar3 == (Material *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer,pMVar3);
        }
        *(undefined8 *)(lVar19 + uVar31 * 8) = uVar14;
        lVar15 = (**(code **)(*(long *)serializer + 0x30))(serializer,pMVar3);
        if (lVar15 == 0) {
          lVar15 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,1);
          puVar32 = *(undefined8 **)(lVar15 + 8);
          *(int *)((long)puVar32 + 0xc) = pMVar3->m_flags;
          *puVar32 = *(undefined8 *)&pMVar3->m_kLST;
          *(btScalar *)(puVar32 + 1) = pMVar3->m_kVST;
          (**(code **)(*(long *)serializer + 0x28))
                    (serializer,lVar15,"SoftBodyMaterialData",0x544d4253,pMVar3);
        }
        uVar31 = uVar31 + 1;
      } while (uVar2 != uVar31);
    }
    (**(code **)(*(long *)serializer + 0x28))(serializer,lVar13,"SoftBodyMaterialData",0x59415241);
  }
  pvVar23 = local_d8;
  iVar18 = (this->m_nodes).m_size;
  *(int *)((long)local_d8 + 0x15c) = iVar18;
  if (iVar18 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (**(code **)(*(long *)serializer + 0x38))(serializer,&this->m_nodes);
  }
  *(long *)((long)pvVar23 + 0x120) = lVar13;
  if (lVar13 != 0) {
    iVar18 = *(int *)((long)pvVar23 + 0x15c);
    lVar13 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x68,iVar18);
    puVar32 = *(undefined8 **)(lVar13 + 8);
    local_dc = 0;
    if (0 < iVar18) {
      do {
        pNVar4 = (this->m_nodes).m_data;
        lVar19 = 0x10;
        do {
          *(undefined4 *)((long)puVar32 + lVar19 * 4 + -8) =
               *(undefined4 *)
                ((long)&(((Node *)(&pNVar4[local_dc].m_x + -1))->super_Feature).super_Element.m_tag
                + lVar19 * 4);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x14);
        *(btScalar *)((long)puVar32 + 0x5c) = pNVar4[local_dc].m_area;
        *(uint *)(puVar32 + 0xc) = -((byte)pNVar4[local_dc].field_0x70 & 1);
        *(btScalar *)(puVar32 + 0xb) = pNVar4[local_dc].m_im;
        if (pNVar4[local_dc].super_Feature.m_material == (Material *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
        }
        *puVar32 = uVar14;
        local_c8.m_pointer = (this->m_nodes).m_data + local_dc;
        lVar19 = 0x14;
        do {
          *(undefined4 *)((long)puVar32 + lVar19 * 4 + -8) =
               *(undefined4 *)((long)local_c8.m_pointer + lVar19 * 4);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x18);
        lVar19 = 4;
        do {
          *(undefined4 *)((long)puVar32 + lVar19 * 4 + -8) =
               *(undefined4 *)((long)local_c8.m_pointer + lVar19 * 4);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 8);
        lVar19 = 8;
        do {
          *(undefined4 *)((long)puVar32 + lVar19 * 4 + -8) =
               *(undefined4 *)((long)local_c8.m_pointer + lVar19 * 4);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0xc);
        lVar19 = 0xc;
        do {
          *(undefined4 *)((long)puVar32 + lVar19 * 4 + -8) =
               *(undefined4 *)((long)local_c8.m_pointer + lVar19 * 4);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        btHashMap<btHashPtr,_int>::insert(&local_b0,(btHashPtr *)&local_c8,&local_dc);
        local_dc = local_dc + 1;
        puVar32 = puVar32 + 0xd;
      } while (local_dc < iVar18);
    }
    (**(code **)(*(long *)serializer + 0x28))(serializer,lVar13,"SoftBodyNodeData",0x444e4253);
    pvVar23 = local_d8;
  }
  iVar18 = (this->m_links).m_size;
  *(int *)((long)pvVar23 + 0x160) = iVar18;
  if (iVar18 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_links).m_data);
  }
  *(long *)((long)pvVar23 + 0x128) = lVar13;
  if (lVar13 != 0) {
    uVar2 = *(uint *)((long)pvVar23 + 0x160);
    lVar13 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x18,(ulong)uVar2);
    if (0 < (int)uVar2) {
      piVar22 = (int *)(*(long *)(lVar13 + 8) + 0x14);
      lVar19 = 0;
      do {
        pLVar5 = (this->m_links).m_data;
        *piVar22 = -(*(byte *)((long)(&pLVar5->m_c3 + -1) + lVar19) & 1);
        if (*(long *)((long)pLVar5->m_n + lVar19 + -8) == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
        }
        *(undefined8 *)(piVar22 + -5) = uVar14;
        pLVar5 = (this->m_links).m_data;
        lVar15 = *(long *)((long)pLVar5->m_n + lVar19);
        iVar18 = -1;
        iVar24 = -1;
        if (lVar15 != 0) {
          iVar24 = (int)((ulong)(lVar15 - (long)(this->m_nodes).m_data) >> 3) * -0x11111111;
        }
        piVar22[-3] = iVar24;
        lVar15 = *(long *)((long)pLVar5->m_n + lVar19 + 8);
        if (lVar15 != 0) {
          iVar18 = (int)((ulong)(lVar15 - (long)(this->m_nodes).m_data) >> 3) * -0x11111111;
        }
        piVar22[-2] = iVar18;
        piVar22[-1] = *(int *)((long)pLVar5->m_n + lVar19 + 0x10);
        lVar19 = lVar19 + 0x48;
        piVar22 = piVar22 + 6;
      } while ((ulong)uVar2 * 0x48 != lVar19);
    }
    (**(code **)(*(long *)serializer + 0x28))(serializer,lVar13,"SoftBodyLinkData",0x59415241);
  }
  iVar18 = (this->m_faces).m_size;
  *(int *)((long)pvVar23 + 0x164) = iVar18;
  if (iVar18 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_faces).m_data);
  }
  *(long *)((long)pvVar23 + 0x130) = lVar13;
  if (lVar13 != 0) {
    uVar2 = *(uint *)((long)pvVar23 + 0x164);
    lVar13 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x28,(ulong)uVar2);
    if (0 < (int)uVar2) {
      lVar19 = *(long *)(lVar13 + 8);
      lVar33 = 0x28;
      lVar15 = 0x10;
      uVar31 = 0;
      do {
        if ((this->m_faces).m_data[uVar31].super_Feature.m_material == (Material *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (**(code **)(*(long *)serializer + 0x38))();
        }
        *(undefined8 *)(lVar19 + 0x10) = uVar14;
        pFVar6 = (this->m_faces).m_data;
        lVar25 = 0;
        do {
          *(undefined4 *)(lVar19 + lVar25 * 4) =
               *(undefined4 *)((long)pFVar6->m_n + lVar25 * 4 + lVar33 + -0x10);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        pNVar4 = (this->m_nodes).m_data;
        lVar25 = 0;
        do {
          lVar28 = *(long *)((long)pFVar6->m_n + lVar25 * 8 + lVar15 + -0x10);
          if (lVar28 == 0) {
            iVar18 = -1;
          }
          else {
            iVar18 = (int)((ulong)(lVar28 - (long)pNVar4) >> 3) * -0x11111111;
          }
          *(int *)(lVar19 + 0x18 + lVar25 * 4) = iVar18;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 3);
        *(btScalar *)(lVar19 + 0x24) = pFVar6[uVar31].m_ra;
        uVar31 = uVar31 + 1;
        lVar19 = lVar19 + 0x28;
        lVar33 = lVar33 + 0x48;
        lVar15 = lVar15 + 0x48;
      } while (uVar31 != uVar2);
    }
    (**(code **)(*(long *)serializer + 0x28))(serializer,lVar13,"SoftBodyFaceData",0x59415241);
    pvVar23 = local_d8;
  }
  iVar18 = (this->m_tetras).m_size;
  *(int *)((long)pvVar23 + 0x168) = iVar18;
  if (iVar18 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_tetras).m_data);
  }
  *(long *)((long)pvVar23 + 0x138) = lVar13;
  if (lVar13 != 0) {
    uVar2 = *(uint *)((long)pvVar23 + 0x168);
    lVar13 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x68,(ulong)uVar2);
    if (0 < (int)uVar2) {
      lVar19 = *(long *)(lVar13 + 8);
      lVar15 = 0x40;
      uVar31 = 0;
      do {
        pNVar4 = (this->m_nodes).m_data;
        pTVar7 = (this->m_tetras).m_data;
        lVar33 = (long)pTVar7->m_n + lVar15 + -0x10;
        lVar28 = 0;
        lVar25 = lVar19;
        do {
          lVar29 = 0;
          do {
            *(undefined4 *)(lVar25 + lVar29 * 4) = *(undefined4 *)(lVar33 + lVar29 * 4);
            lVar29 = lVar29 + 1;
          } while (lVar29 != 4);
          lVar29 = *(long *)((long)pTVar7 + lVar28 * 0x90 + 0x10);
          if (lVar29 == 0) {
            iVar18 = -1;
          }
          else {
            iVar18 = (int)((ulong)(lVar29 - (long)pNVar4) >> 3) * -0x11111111;
          }
          *(int *)(lVar19 + 0x48 + lVar28 * 4) = iVar18;
          lVar28 = lVar28 + 1;
          lVar25 = lVar25 + 0x10;
          lVar33 = lVar33 + 0x10;
        } while (lVar28 != 4);
        pTVar7 = (this->m_tetras).m_data;
        *(undefined8 *)(lVar19 + 0x5c) = *(undefined8 *)&pTVar7[uVar31].m_c1;
        if (pTVar7[uVar31].super_Feature.m_material == (Material *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (**(code **)(*(long *)serializer + 0x38))();
        }
        *(undefined8 *)(lVar19 + 0x40) = uVar14;
        *(btScalar *)(lVar19 + 0x58) = (this->m_tetras).m_data[uVar31].m_rv;
        uVar31 = uVar31 + 1;
        lVar19 = lVar19 + 0x68;
        lVar15 = lVar15 + 0x88;
      } while (uVar31 != uVar2);
    }
    (**(code **)(*(long *)serializer + 0x28))(serializer,lVar13,"SoftBodyTetraData",0x59415241);
    pvVar23 = local_d8;
  }
  iVar18 = (this->m_anchors).m_size;
  *(int *)((long)pvVar23 + 0x16c) = iVar18;
  if (iVar18 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_anchors).m_data);
  }
  *(long *)((long)pvVar23 + 0x140) = lVar13;
  if (lVar13 != 0) {
    uVar2 = *(uint *)((long)pvVar23 + 0x16c);
    local_d0 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x60,(ulong)uVar2);
    if (0 < (int)uVar2) {
      lVar13 = *(long *)(local_d0 + 8);
      lVar33 = 0x24;
      lVar19 = 0x54;
      lVar15 = 8;
      uVar31 = 0;
      do {
        pAVar8 = (this->m_anchors).m_data;
        pAVar16 = pAVar8 + uVar31;
        lVar25 = (long)(pAVar8->m_local).m_floats + lVar33 + -8;
        lVar29 = 0;
        lVar28 = lVar13;
        do {
          lVar30 = 0;
          do {
            *(undefined4 *)(lVar28 + lVar30 * 4) = *(undefined4 *)(lVar25 + lVar30 * 4);
            lVar30 = lVar30 + 1;
          } while (lVar30 != 4);
          lVar29 = lVar29 + 1;
          lVar28 = lVar28 + 0x10;
          lVar25 = lVar25 + 0x10;
        } while (lVar29 != 3);
        lVar25 = 0;
        do {
          *(undefined4 *)(lVar13 + 0x30 + lVar25 * 4) =
               *(undefined4 *)((long)(pAVar8->m_local).m_floats + lVar25 * 4 + lVar19 + -8);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        *(btScalar *)(lVar13 + 0x5c) = pAVar16->m_c2;
        lVar25 = 0;
        do {
          *(undefined4 *)(lVar13 + 0x40 + lVar25 * 4) =
               *(undefined4 *)((long)(pAVar8->m_local).m_floats + lVar25 * 4 + lVar15 + -8);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        if (pAVar16->m_node == (Node *)0x0) {
          iVar18 = -1;
        }
        else {
          iVar18 = (int)((ulong)((long)pAVar16->m_node - (long)(this->m_nodes).m_data) >> 3) *
                   -0x11111111;
        }
        *(int *)(lVar13 + 0x58) = iVar18;
        if (pAVar16->m_body == (btRigidBody *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar14 = (**(code **)(*(long *)serializer + 0x38))();
        }
        *(undefined8 *)(lVar13 + 0x50) = uVar14;
        uVar31 = uVar31 + 1;
        lVar13 = lVar13 + 0x60;
        lVar33 = lVar33 + 0x68;
        lVar19 = lVar19 + 0x68;
        lVar15 = lVar15 + 0x68;
      } while (uVar31 != uVar2);
    }
    (**(code **)(*(long *)serializer + 0x28))
              (serializer,local_d0,"SoftRigidAnchorData",0x59415241,(this->m_anchors).m_data);
    pvVar23 = local_d8;
  }
  *(btScalar *)((long)pvVar23 + 0x194) = (this->m_cfg).kDF;
  *(btScalar *)((long)pvVar23 + 0x17c) = (this->m_cfg).kVCF;
  *(btScalar *)((long)pvVar23 + 0x18c) = (this->m_cfg).kPR;
  *(_ *)((long)pvVar23 + 0x178) = (this->m_cfg).aeromodel;
  *(undefined8 *)((long)pvVar23 + 0x184) = *(undefined8 *)&(this->m_cfg).kDG;
  uVar14 = *(undefined8 *)&(this->m_cfg).diterations;
  *(undefined8 *)((long)pvVar23 + 0x1cc) = *(undefined8 *)&(this->m_cfg).viterations;
  *(undefined8 *)((long)pvVar23 + 0x1d4) = uVar14;
  bVar1 = (this->m_cfg).maxvolume;
  *(btScalar *)((long)pvVar23 + 0x1c4) = bVar1;
  *(btScalar *)((long)pvVar23 + 0x180) = (this->m_cfg).kDP;
  *(int *)((long)pvVar23 + 0x1dc) = (this->m_cfg).collisions;
  *(btScalar *)((long)pvVar23 + 400) = (this->m_cfg).kVC;
  uVar14 = *(undefined8 *)&(this->m_cfg).kKHR;
  *(undefined8 *)((long)pvVar23 + 0x198) = *(undefined8 *)&(this->m_cfg).kMT;
  *(undefined8 *)((long)pvVar23 + 0x1a0) = uVar14;
  *(btScalar *)((long)pvVar23 + 0x1c8) = (this->m_cfg).timescale;
  *(btScalar *)((long)pvVar23 + 0x1c4) = bVar1;
  uVar14 = *(undefined8 *)&(this->m_cfg).kSKHR_CL;
  *(undefined8 *)((long)pvVar23 + 0x1a8) = *(undefined8 *)&(this->m_cfg).kAHR;
  *(undefined8 *)((long)pvVar23 + 0x1b0) = uVar14;
  *(undefined8 *)((long)pvVar23 + 0x1b8) = *(undefined8 *)&(this->m_cfg).kSR_SPLT_CL;
  *(btScalar *)((long)pvVar23 + 0x1c0) = (this->m_cfg).kSS_SPLT_CL;
  uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer,&this->m_pose);
  *(undefined8 *)((long)pvVar23 + 0x110) = uVar14;
  lVar15 = (**(code **)(*(long *)serializer + 0x20))(serializer,200,1);
  lVar19 = *(long *)(lVar15 + 8);
  pbVar17 = &(this->m_pose).m_aqq;
  lVar13 = lVar19 + 0x60;
  lVar33 = 0;
  do {
    lVar25 = 0;
    do {
      *(btScalar *)(lVar13 + lVar25 * 4) = pbVar17->m_el[0].m_floats[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar25 != 4);
    lVar33 = lVar33 + 1;
    lVar13 = lVar13 + 0x10;
    pbVar17 = (btMatrix3x3 *)(pbVar17->m_el + 1);
  } while (lVar33 != 3);
  *(uint *)(lVar19 + 0xbc) = (uint)(this->m_pose).m_bframe;
  *(uint *)(lVar19 + 0xb8) = (uint)(this->m_pose).m_bvolume;
  lVar13 = 0;
  do {
    *(btScalar *)(lVar19 + 0x90 + lVar13 * 4) = (this->m_pose).m_com.m_floats[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  iVar18 = (this->m_pose).m_pos.m_size;
  *(int *)(lVar19 + 0xb0) = iVar18;
  if (iVar18 == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
  }
  *(undefined8 *)(lVar19 + 0xa0) = uVar14;
  uVar2 = *(uint *)(lVar19 + 0xb0);
  uVar31 = (ulong)uVar2;
  if (uVar31 != 0) {
    lVar13 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,uVar31);
    if (0 < (int)uVar2) {
      lVar33 = *(long *)(lVar13 + 8);
      pbVar21 = (this->m_pose).m_pos.m_data;
      uVar26 = 0;
      do {
        lVar25 = 0;
        do {
          *(btScalar *)(lVar33 + lVar25 * 4) = pbVar21->m_floats[lVar25];
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        uVar26 = uVar26 + 1;
        lVar33 = lVar33 + 0x10;
        pbVar21 = pbVar21 + 1;
      } while (uVar26 != uVar31);
    }
    (**(code **)(*(long *)serializer + 0x28))
              (serializer,lVar13,"btVector3FloatData",0x59415241,(this->m_pose).m_pos.m_data);
  }
  *(btScalar *)(lVar19 + 0xc0) = (this->m_pose).m_volume;
  pbVar17 = &(this->m_pose).m_rot;
  lVar33 = 0;
  lVar13 = lVar19;
  do {
    lVar25 = 0;
    do {
      *(btScalar *)(lVar13 + lVar25 * 4) = pbVar17->m_el[0].m_floats[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar25 != 4);
    lVar33 = lVar33 + 1;
    lVar13 = lVar13 + 0x10;
    pbVar17 = (btMatrix3x3 *)(pbVar17->m_el + 1);
  } while (lVar33 != 3);
  pbVar17 = &(this->m_pose).m_scl;
  lVar13 = lVar19 + 0x30;
  lVar33 = 0;
  do {
    lVar25 = 0;
    do {
      *(btScalar *)(lVar13 + lVar25 * 4) = pbVar17->m_el[0].m_floats[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar25 != 4);
    lVar33 = lVar33 + 1;
    lVar13 = lVar13 + 0x10;
    pbVar17 = (btMatrix3x3 *)(pbVar17->m_el + 1);
  } while (lVar33 != 3);
  iVar18 = (this->m_pose).m_wgh.m_size;
  *(int *)(lVar19 + 0xb4) = iVar18;
  if (iVar18 == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_pose).m_wgh.m_data);
  }
  *(undefined8 *)(lVar19 + 0xa8) = uVar14;
  uVar2 = *(uint *)(lVar19 + 0xb4);
  uVar31 = (ulong)uVar2;
  if (uVar31 != 0) {
    lVar13 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,uVar31);
    if (0 < (int)uVar2) {
      lVar19 = *(long *)(lVar13 + 8);
      pfVar9 = (this->m_pose).m_wgh.m_data;
      uVar26 = 0;
      do {
        *(float *)(lVar19 + uVar26 * 4) = pfVar9[uVar26];
        uVar26 = uVar26 + 1;
      } while (uVar31 != uVar26);
    }
    (**(code **)(*(long *)serializer + 0x28))
              (serializer,lVar13,"float",0x59415241,(this->m_pose).m_wgh.m_data);
  }
  (**(code **)(*(long *)serializer + 0x28))
            (serializer,lVar15,"SoftBodyPoseData",0x59415241,&this->m_pose);
  pvVar23 = local_d8;
  iVar18 = (this->m_clusters).m_size;
  *(int *)((long)local_d8 + 0x170) = iVar18;
  if (iVar18 == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer,*(this->m_clusters).m_data);
  }
  *(undefined8 *)((long)pvVar23 + 0x148) = uVar14;
  uVar2 = *(uint *)((long)pvVar23 + 0x170);
  uVar31 = (ulong)uVar2;
  if (uVar31 != 0) {
    local_c0 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x168,uVar31);
    if (0 < (int)uVar2) {
      lVar13 = *(long *)(local_c0 + 8);
      local_f0 = lVar13 + 0x70;
      local_d0 = lVar13 + 0x40;
      uVar26 = 0;
      local_b8 = uVar31;
      do {
        pCVar10 = (this->m_clusters).m_data[uVar26];
        *(btScalar *)(lVar13 + 0x14c) = pCVar10->m_adamping;
        lVar19 = 0;
        do {
          *(btScalar *)(lVar13 + 0x100 + lVar19 * 4) = (pCVar10->m_av).m_floats[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        *(int *)(lVar13 + 0x164) = pCVar10->m_clusterIndex;
        *(uint *)(lVar13 + 0x160) = (uint)pCVar10->m_collide;
        lVar19 = 0;
        do {
          *(btScalar *)(lVar13 + 0xa0 + lVar19 * 4) = (pCVar10->m_com).m_floats[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        *(uint *)(lVar13 + 0x15c) = (uint)pCVar10->m_containsAnchor;
        lVar19 = 0;
        do {
          *(btScalar *)(lVar13 + 0xd0 + lVar19 * 4) = pCVar10->m_dimpulses[0].m_floats[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        lVar19 = 0;
        do {
          *(btScalar *)(lVar13 + 0xe0 + lVar19 * 4) = (pCVar10->m_lv).m_floats[lVar19 + -6];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        pbVar20 = &pCVar10->m_framexform;
        lVar15 = 0;
        lVar19 = lVar13;
        do {
          lVar33 = 0;
          do {
            *(btScalar *)(lVar19 + lVar33 * 4) = (pbVar20->m_basis).m_el[0].m_floats[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 4);
          lVar15 = lVar15 + 1;
          lVar19 = lVar19 + 0x10;
          pbVar20 = (btTransform *)((pbVar20->m_basis).m_el + 1);
        } while (lVar15 != 3);
        lVar19 = 0;
        do {
          *(btScalar *)(lVar13 + 0x30 + lVar19 * 4) =
               (pCVar10->m_framexform).m_origin.m_floats[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        *(undefined8 *)(lVar13 + 0x134) = *(undefined8 *)&pCVar10->m_idmass;
        pbVar17 = &pCVar10->m_invwi;
        lVar15 = 0;
        lVar19 = local_f0;
        do {
          lVar33 = 0;
          do {
            *(btScalar *)(lVar19 + lVar33 * 4) = pbVar17->m_el[0].m_floats[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 4);
          lVar15 = lVar15 + 1;
          lVar19 = lVar19 + 0x10;
          pbVar17 = (btMatrix3x3 *)(pbVar17->m_el + 1);
        } while (lVar15 != 3);
        *(btScalar *)(lVar13 + 0x148) = pCVar10->m_ldamping;
        pbVar17 = &pCVar10->m_locii;
        lVar15 = 0;
        lVar19 = local_d0;
        do {
          lVar33 = 0;
          do {
            *(btScalar *)(lVar19 + lVar33 * 4) = pbVar17->m_el[0].m_floats[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 4);
          lVar15 = lVar15 + 1;
          lVar19 = lVar19 + 0x10;
          pbVar17 = (btMatrix3x3 *)(pbVar17->m_el + 1);
        } while (lVar15 != 3);
        lVar19 = 0;
        do {
          *(btScalar *)(lVar13 + 0xf0 + lVar19 * 4) = (pCVar10->m_lv).m_floats[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        *(btScalar *)(lVar13 + 0x154) = pCVar10->m_maxSelfCollisionImpulse;
        uVar14 = *(undefined8 *)&pCVar10->m_adamping;
        *(undefined8 *)(lVar13 + 0x144) = *(undefined8 *)&pCVar10->m_ndamping;
        *(undefined8 *)(lVar13 + 0x14c) = uVar14;
        *(btScalar *)(lVar13 + 0x158) = pCVar10->m_selfCollisionImpulseFactor;
        iVar18 = (pCVar10->m_framerefs).m_size;
        *(int *)(lVar13 + 0x128) = iVar18;
        *(int *)(lVar13 + 0x130) = (pCVar10->m_masses).m_size;
        *(int *)(lVar13 + 300) = (pCVar10->m_nodes).m_size;
        *(int *)(lVar13 + 0x13c) = pCVar10->m_nvimpulses;
        lVar19 = 0;
        do {
          *(btScalar *)(lVar13 + 0xb0 + lVar19 * 4) = pCVar10->m_vimpulses[0].m_floats[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        lVar19 = 0;
        do {
          *(btScalar *)(lVar13 + 0xc0 + lVar19 * 4) = pCVar10->m_vimpulses[1].m_floats[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        *(int *)(lVar13 + 0x140) = pCVar10->m_ndimpulses;
        if (iVar18 == 0) {
          lVar19 = 0;
        }
        else {
          lVar19 = (**(code **)(*(long *)serializer + 0x38))();
        }
        *(long *)(lVar13 + 0x110) = lVar19;
        if (lVar19 != 0) {
          uVar2 = *(uint *)(lVar13 + 0x128);
          lVar19 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,(ulong)uVar2);
          if (0 < (int)uVar2) {
            lVar15 = *(long *)(lVar19 + 8);
            pbVar21 = ((this->m_clusters).m_data[uVar26]->m_framerefs).m_data;
            uVar27 = 0;
            do {
              lVar33 = 0;
              do {
                *(btScalar *)(lVar15 + lVar33 * 4) = pbVar21->m_floats[lVar33];
                lVar33 = lVar33 + 1;
              } while (lVar33 != 4);
              uVar27 = uVar27 + 1;
              lVar15 = lVar15 + 0x10;
              pbVar21 = pbVar21 + 1;
            } while (uVar27 != uVar2);
          }
          (**(code **)(*(long *)serializer + 0x28))
                    (serializer,lVar19,"btVector3FloatData",0x59415241,
                     ((this->m_clusters).m_data[uVar26]->m_framerefs).m_data);
        }
        if (*(int *)(lVar13 + 0x130) == 0) {
          lVar19 = 0;
        }
        else {
          lVar19 = (**(code **)(*(long *)serializer + 0x38))();
        }
        *(long *)(lVar13 + 0x120) = lVar19;
        if (lVar19 != 0) {
          uVar2 = *(uint *)(lVar13 + 0x130);
          lVar19 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,(ulong)uVar2);
          if (0 < (int)uVar2) {
            lVar15 = *(long *)(lVar19 + 8);
            pfVar9 = ((this->m_clusters).m_data[uVar26]->m_masses).m_data;
            uVar27 = 0;
            do {
              *(float *)(lVar15 + uVar27 * 4) = pfVar9[uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar2 != uVar27);
          }
          (**(code **)(*(long *)serializer + 0x28))
                    (serializer,lVar19,"float",0x59415241,
                     ((this->m_clusters).m_data[uVar26]->m_masses).m_data);
        }
        if (*(int *)(lVar13 + 300) == 0) {
          lVar19 = 0;
        }
        else {
          lVar19 = (**(code **)(*(long *)serializer + 0x38))();
        }
        *(long *)(lVar13 + 0x118) = lVar19;
        if (lVar19 != 0) {
          uVar2 = *(uint *)(lVar13 + 0x130);
          lVar19 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,(ulong)uVar2);
          if (0 < (int)uVar2) {
            lVar15 = *(long *)(lVar19 + 8);
            uVar31 = 0;
            do {
              local_c8 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)
                          (((this->m_clusters).m_data[uVar26]->m_nodes).m_data + uVar31);
              iVar18 = btHashMap<btHashPtr,_int>::findIndex(&local_b0,(btHashPtr *)&local_c8);
              *(int *)(lVar15 + uVar31 * 4) = local_b0.m_valueArray.m_data[iVar18];
              uVar31 = uVar31 + 1;
            } while (uVar2 != uVar31);
          }
          (**(code **)(*(long *)serializer + 0x28))
                    (serializer,lVar19,"int",0x59415241,&(this->m_clusters).m_data[uVar26]->m_nodes)
          ;
          uVar31 = local_b8;
        }
        uVar26 = uVar26 + 1;
        lVar13 = lVar13 + 0x168;
        local_f0 = local_f0 + 0x168;
        local_d0 = local_d0 + 0x168;
      } while (uVar26 != uVar31);
    }
    (**(code **)(*(long *)serializer + 0x28))
              (serializer,local_c0,"SoftBodyClusterData",0x59415241,*(this->m_clusters).m_data);
    pvVar23 = local_d8;
  }
  iVar18 = (this->m_joints).m_size;
  *(int *)((long)pvVar23 + 0x174) = iVar18;
  if (iVar18 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_joints).m_data);
  }
  *(long *)((long)pvVar23 + 0x150) = lVar13;
  if (lVar13 != 0) {
    uVar2 = (this->m_joints).m_size;
    lVar13 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x70,(ulong)uVar2);
    if (0 < (int)uVar2) {
      puVar32 = *(undefined8 **)(lVar13 + 8);
      uVar31 = 0;
      do {
        iVar18 = (*(this->m_joints).m_data[uVar31]->_vptr_Joint[5])();
        *(int *)(puVar32 + 0xd) = iVar18;
        ppJVar11 = (this->m_joints).m_data;
        pJVar12 = ppJVar11[uVar31];
        lVar19 = 0;
        do {
          *(btScalar *)((long)puVar32 + lVar19 * 4 + 0x10) = pJVar12->m_refs[0].m_floats[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        lVar19 = 0;
        do {
          *(btScalar *)((long)puVar32 + lVar19 * 4 + 0x20) =
               (pJVar12->m_drift).m_floats[lVar19 + -7];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        puVar32[6] = *(undefined8 *)&pJVar12->m_cfm;
        *(btScalar *)(puVar32 + 7) = pJVar12->m_split;
        *(uint *)((long)puVar32 + 0x3c) = (uint)pJVar12->m_delete;
        puVar32[8] = 0;
        puVar32[9] = 0;
        puVar32[10] = 0;
        puVar32[0xb] = 0;
        *puVar32 = 0;
        puVar32[1] = 0;
        if (ppJVar11[uVar31]->m_bodies[0].m_soft != (Cluster *)0x0) {
          *(undefined4 *)(puVar32 + 0xc) = 1;
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          *puVar32 = uVar14;
        }
        if ((this->m_joints).m_data[uVar31]->m_bodies[0].m_collisionObject !=
            (btCollisionObject *)0x0) {
          *(undefined4 *)(puVar32 + 0xc) = 3;
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          *puVar32 = uVar14;
        }
        if ((this->m_joints).m_data[uVar31]->m_bodies[0].m_rigid != (btRigidBody *)0x0) {
          *(undefined4 *)(puVar32 + 0xc) = 2;
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          *puVar32 = uVar14;
        }
        if ((this->m_joints).m_data[uVar31]->m_bodies[1].m_soft != (Cluster *)0x0) {
          *(undefined4 *)((long)puVar32 + 100) = 1;
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          puVar32[1] = uVar14;
        }
        if ((this->m_joints).m_data[uVar31]->m_bodies[1].m_collisionObject !=
            (btCollisionObject *)0x0) {
          *(undefined4 *)((long)puVar32 + 100) = 3;
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          puVar32[1] = uVar14;
        }
        if ((this->m_joints).m_data[uVar31]->m_bodies[1].m_rigid != (btRigidBody *)0x0) {
          *(undefined4 *)((long)puVar32 + 100) = 2;
          uVar14 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          puVar32[1] = uVar14;
        }
        uVar31 = uVar31 + 1;
        puVar32 = puVar32 + 0xe;
      } while (uVar31 != uVar2);
    }
    (**(code **)(*(long *)serializer + 0x28))
              (serializer,lVar13,"btSoftBodyJointData",0x59415241,(this->m_joints).m_data);
  }
  btAlignedObjectArray<btHashPtr>::~btAlignedObjectArray(&local_b0.m_keyArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b0.m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b0.m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b0.m_hashTable);
  return "btSoftBodyFloatData";
}

Assistant:

const char*	btSoftBody::serialize(void* dataBuffer, class btSerializer* serializer) const
{
	btSoftBodyData* sbd = (btSoftBodyData*) dataBuffer;

	btCollisionObject::serialize(&sbd->m_collisionObjectData, serializer);

	btHashMap<btHashPtr,int>	m_nodeIndexMap;

	sbd->m_numMaterials = m_materials.size();
	sbd->m_materials = sbd->m_numMaterials? (SoftBodyMaterialData**) serializer->getUniquePointer((void*)&m_materials): 0;

	if (sbd->m_materials)
	{
		int sz = sizeof(SoftBodyMaterialData*);
		int numElem = sbd->m_numMaterials;
		btChunk* chunk = serializer->allocate(sz,numElem);
		//SoftBodyMaterialData** memPtr = chunk->m_oldPtr;
		SoftBodyMaterialData** memPtr = (SoftBodyMaterialData**)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			btSoftBody::Material* mat = m_materials[i];
			*memPtr = mat ? (SoftBodyMaterialData*)serializer->getUniquePointer((void*)mat) : 0;
			if (!serializer->findPointer(mat))
			{
				//serialize it here
				btChunk* chunk = serializer->allocate(sizeof(SoftBodyMaterialData),1);
				SoftBodyMaterialData* memPtr = (SoftBodyMaterialData*)chunk->m_oldPtr;
				memPtr->m_flags = mat->m_flags;
				memPtr->m_angularStiffness = mat->m_kAST;
				memPtr->m_linearStiffness = mat->m_kLST;
				memPtr->m_volumeStiffness = mat->m_kVST;
				serializer->finalizeChunk(chunk,"SoftBodyMaterialData",BT_SBMATERIAL_CODE,mat);
			}
		}
		serializer->finalizeChunk(chunk,"SoftBodyMaterialData",BT_ARRAY_CODE,(void*) &m_materials);
	}


	

	sbd->m_numNodes = m_nodes.size();
	sbd->m_nodes = sbd->m_numNodes ? (SoftBodyNodeData*)serializer->getUniquePointer((void*)&m_nodes): 0;
	if (sbd->m_nodes)
	{
		int sz = sizeof(SoftBodyNodeData);
		int numElem = sbd->m_numNodes;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyNodeData* memPtr = (SoftBodyNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_nodes[i].m_f.serializeFloat( memPtr->m_accumulatedForce);
			memPtr->m_area = m_nodes[i].m_area;
			memPtr->m_attach = m_nodes[i].m_battach;
			memPtr->m_inverseMass = m_nodes[i].m_im;
			memPtr->m_material = m_nodes[i].m_material? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_nodes[i].m_material):0;
			m_nodes[i].m_n.serializeFloat(memPtr->m_normal);
			m_nodes[i].m_x.serializeFloat(memPtr->m_position);
			m_nodes[i].m_q.serializeFloat(memPtr->m_previousPosition);
			m_nodes[i].m_v.serializeFloat(memPtr->m_velocity);
			m_nodeIndexMap.insert(&m_nodes[i],i);
		}
		serializer->finalizeChunk(chunk,"SoftBodyNodeData",BT_SBNODE_CODE,(void*) &m_nodes);
	}

	sbd->m_numLinks = m_links.size();
	sbd->m_links = sbd->m_numLinks? (SoftBodyLinkData*) serializer->getUniquePointer((void*)&m_links[0]):0;
	if (sbd->m_links)
	{
		int sz = sizeof(SoftBodyLinkData);
		int numElem = sbd->m_numLinks;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyLinkData* memPtr = (SoftBodyLinkData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_bbending = m_links[i].m_bbending;
			memPtr->m_material = m_links[i].m_material? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_links[i].m_material):0;
			memPtr->m_nodeIndices[0] = m_links[i].m_n[0] ? m_links[i].m_n[0] - &m_nodes[0]: -1;
			memPtr->m_nodeIndices[1] = m_links[i].m_n[1] ? m_links[i].m_n[1] - &m_nodes[0]: -1;
			btAssert(memPtr->m_nodeIndices[0]<m_nodes.size());
			btAssert(memPtr->m_nodeIndices[1]<m_nodes.size());
			memPtr->m_restLength = m_links[i].m_rl;
		}
		serializer->finalizeChunk(chunk,"SoftBodyLinkData",BT_ARRAY_CODE,(void*) &m_links[0]);

	}


	sbd->m_numFaces = m_faces.size();
	sbd->m_faces = sbd->m_numFaces? (SoftBodyFaceData*) serializer->getUniquePointer((void*)&m_faces[0]):0;
	if (sbd->m_faces)
	{
		int sz = sizeof(SoftBodyFaceData);
		int numElem = sbd->m_numFaces;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyFaceData* memPtr = (SoftBodyFaceData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_material = m_faces[i].m_material ?  (SoftBodyMaterialData*) serializer->getUniquePointer((void*)m_faces[i].m_material): 0;
			m_faces[i].m_normal.serializeFloat(	memPtr->m_normal);
			for (int j=0;j<3;j++)
			{
				memPtr->m_nodeIndices[j] = m_faces[i].m_n[j]? m_faces[i].m_n[j] - &m_nodes[0]: -1;
			}
			memPtr->m_restArea = m_faces[i].m_ra;
		}
		serializer->finalizeChunk(chunk,"SoftBodyFaceData",BT_ARRAY_CODE,(void*) &m_faces[0]);
	}


	sbd->m_numTetrahedra = m_tetras.size();
	sbd->m_tetrahedra = sbd->m_numTetrahedra ? (SoftBodyTetraData*) serializer->getUniquePointer((void*)&m_tetras[0]):0;
	if (sbd->m_tetrahedra)
	{
		int sz = sizeof(SoftBodyTetraData);
		int numElem = sbd->m_numTetrahedra;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyTetraData* memPtr = (SoftBodyTetraData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			for (int j=0;j<4;j++)
			{
				m_tetras[i].m_c0[j].serializeFloat(	memPtr->m_c0[j] );
				memPtr->m_nodeIndices[j] = m_tetras[j].m_n[j]? m_tetras[j].m_n[j]-&m_nodes[0] : -1;
			}
			memPtr->m_c1 = m_tetras[i].m_c1;
			memPtr->m_c2 = m_tetras[i].m_c2;
			memPtr->m_material = m_tetras[i].m_material ? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_tetras[i].m_material): 0;
			memPtr->m_restVolume = m_tetras[i].m_rv;
		}
		serializer->finalizeChunk(chunk,"SoftBodyTetraData",BT_ARRAY_CODE,(void*) &m_tetras[0]);
	}

	sbd->m_numAnchors = m_anchors.size();
	sbd->m_anchors = sbd->m_numAnchors ? (SoftRigidAnchorData*) serializer->getUniquePointer((void*)&m_anchors[0]):0;
	if (sbd->m_anchors)
	{
		int sz = sizeof(SoftRigidAnchorData);
		int numElem = sbd->m_numAnchors;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftRigidAnchorData* memPtr = (SoftRigidAnchorData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_anchors[i].m_c0.serializeFloat(memPtr->m_c0);
			m_anchors[i].m_c1.serializeFloat(memPtr->m_c1);
			memPtr->m_c2 = m_anchors[i].m_c2;
			m_anchors[i].m_local.serializeFloat(memPtr->m_localFrame);
			memPtr->m_nodeIndex = m_anchors[i].m_node? m_anchors[i].m_node-&m_nodes[0]: -1;
			
			memPtr->m_rigidBody = m_anchors[i].m_body? (btRigidBodyData*)  serializer->getUniquePointer((void*)m_anchors[i].m_body): 0;
			btAssert(memPtr->m_nodeIndex < m_nodes.size());
		}
		serializer->finalizeChunk(chunk,"SoftRigidAnchorData",BT_ARRAY_CODE,(void*) &m_anchors[0]);
	}
	

	sbd->m_config.m_dynamicFriction = m_cfg.kDF;
	sbd->m_config.m_baumgarte = m_cfg.kVCF;
	sbd->m_config.m_pressure = m_cfg.kPR;
	sbd->m_config.m_aeroModel = this->m_cfg.aeromodel;
	sbd->m_config.m_lift = m_cfg.kLF;
	sbd->m_config.m_drag = m_cfg.kDG;
	sbd->m_config.m_positionIterations = m_cfg.piterations;
	sbd->m_config.m_driftIterations = m_cfg.diterations;
	sbd->m_config.m_clusterIterations = m_cfg.citerations;
	sbd->m_config.m_velocityIterations = m_cfg.viterations;
	sbd->m_config.m_maxVolume = m_cfg.maxvolume;
	sbd->m_config.m_damping = m_cfg.kDP;
	sbd->m_config.m_poseMatch = m_cfg.kMT;
	sbd->m_config.m_collisionFlags = m_cfg.collisions;
	sbd->m_config.m_volume = m_cfg.kVC;
	sbd->m_config.m_rigidContactHardness = m_cfg.kCHR;
	sbd->m_config.m_kineticContactHardness = m_cfg.kKHR;
	sbd->m_config.m_softContactHardness = m_cfg.kSHR;
	sbd->m_config.m_anchorHardness = m_cfg.kAHR;
	sbd->m_config.m_timeScale = m_cfg.timescale;
	sbd->m_config.m_maxVolume = m_cfg.maxvolume;
	sbd->m_config.m_softRigidClusterHardness = m_cfg.kSRHR_CL;
	sbd->m_config.m_softKineticClusterHardness = m_cfg.kSKHR_CL;
	sbd->m_config.m_softSoftClusterHardness = m_cfg.kSSHR_CL;
	sbd->m_config.m_softRigidClusterImpulseSplit = m_cfg.kSR_SPLT_CL;
	sbd->m_config.m_softKineticClusterImpulseSplit = m_cfg.kSK_SPLT_CL;
	sbd->m_config.m_softSoftClusterImpulseSplit = m_cfg.kSS_SPLT_CL;

	//pose for shape matching
	{
		sbd->m_pose = (SoftBodyPoseData*)serializer->getUniquePointer((void*)&m_pose);

		int sz = sizeof(SoftBodyPoseData);
		btChunk* chunk = serializer->allocate(sz,1);
		SoftBodyPoseData* memPtr = (SoftBodyPoseData*)chunk->m_oldPtr;
		
		m_pose.m_aqq.serializeFloat(memPtr->m_aqq);
		memPtr->m_bframe = m_pose.m_bframe;
		memPtr->m_bvolume = m_pose.m_bvolume;
		m_pose.m_com.serializeFloat(memPtr->m_com);
		
		memPtr->m_numPositions = m_pose.m_pos.size();
		memPtr->m_positions = memPtr->m_numPositions ? (btVector3FloatData*)serializer->getUniquePointer((void*)&m_pose.m_pos[0]): 0;
		if (memPtr->m_numPositions)
		{
			int numElem = memPtr->m_numPositions;
			int sz = sizeof(btVector3Data);
			btChunk* chunk = serializer->allocate(sz,numElem);
			btVector3FloatData* memPtr = (btVector3FloatData*)chunk->m_oldPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_pose.m_pos[i].serializeFloat(*memPtr);
			}
			serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)&m_pose.m_pos[0]);
		}
		memPtr->m_restVolume = m_pose.m_volume;
		m_pose.m_rot.serializeFloat(memPtr->m_rot);
		m_pose.m_scl.serializeFloat(memPtr->m_scale);

		memPtr->m_numWeigts = m_pose.m_wgh.size();
		memPtr->m_weights = memPtr->m_numWeigts? (float*) serializer->getUniquePointer((void*) &m_pose.m_wgh[0]) : 0;
		if (memPtr->m_numWeigts)
		{
			
			int numElem = memPtr->m_numWeigts;
			int sz = sizeof(float);
			btChunk* chunk = serializer->allocate(sz,numElem);
			float* memPtr = (float*) chunk->m_oldPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				*memPtr = m_pose.m_wgh[i];
			}
			serializer->finalizeChunk(chunk,"float",BT_ARRAY_CODE,(void*)&m_pose.m_wgh[0]);
		}

		serializer->finalizeChunk(chunk,"SoftBodyPoseData",BT_ARRAY_CODE,(void*)&m_pose);
	}

	//clusters for convex-cluster collision detection

	sbd->m_numClusters = m_clusters.size();
	sbd->m_clusters = sbd->m_numClusters? (SoftBodyClusterData*) serializer->getUniquePointer((void*)m_clusters[0]) : 0;
	if (sbd->m_numClusters)
	{
		int numElem = sbd->m_numClusters;
		int sz = sizeof(SoftBodyClusterData);
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyClusterData* memPtr = (SoftBodyClusterData*) chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_adamping= m_clusters[i]->m_adamping;
			m_clusters[i]->m_av.serializeFloat(memPtr->m_av);
			memPtr->m_clusterIndex = m_clusters[i]->m_clusterIndex;
			memPtr->m_collide = m_clusters[i]->m_collide;
			m_clusters[i]->m_com.serializeFloat(memPtr->m_com);
			memPtr->m_containsAnchor = m_clusters[i]->m_containsAnchor;
			m_clusters[i]->m_dimpulses[0].serializeFloat(memPtr->m_dimpulses[0]);
			m_clusters[i]->m_dimpulses[1].serializeFloat(memPtr->m_dimpulses[1]);
			m_clusters[i]->m_framexform.serializeFloat(memPtr->m_framexform);
			memPtr->m_idmass = m_clusters[i]->m_idmass;
			memPtr->m_imass = m_clusters[i]->m_imass;
			m_clusters[i]->m_invwi.serializeFloat(memPtr->m_invwi);
			memPtr->m_ldamping = m_clusters[i]->m_ldamping;
			m_clusters[i]->m_locii.serializeFloat(memPtr->m_locii);
			m_clusters[i]->m_lv.serializeFloat(memPtr->m_lv);
			memPtr->m_matching = m_clusters[i]->m_matching;
			memPtr->m_maxSelfCollisionImpulse = m_clusters[i]->m_maxSelfCollisionImpulse;
			memPtr->m_ndamping = m_clusters[i]->m_ndamping;
			memPtr->m_ldamping = m_clusters[i]->m_ldamping;
			memPtr->m_adamping = m_clusters[i]->m_adamping;
			memPtr->m_selfCollisionImpulseFactor = m_clusters[i]->m_selfCollisionImpulseFactor;

			memPtr->m_numFrameRefs = m_clusters[i]->m_framerefs.size();
			memPtr->m_numMasses = m_clusters[i]->m_masses.size();
			memPtr->m_numNodes = m_clusters[i]->m_nodes.size();

			memPtr->m_nvimpulses = m_clusters[i]->m_nvimpulses;
			m_clusters[i]->m_vimpulses[0].serializeFloat(memPtr->m_vimpulses[0]);
			m_clusters[i]->m_vimpulses[1].serializeFloat(memPtr->m_vimpulses[1]);
			memPtr->m_ndimpulses = m_clusters[i]->m_ndimpulses;

			

			memPtr->m_framerefs = memPtr->m_numFrameRefs? (btVector3FloatData*)serializer->getUniquePointer((void*)&m_clusters[i]->m_framerefs[0]) : 0;
			if (memPtr->m_framerefs)
			{
				int numElem = memPtr->m_numFrameRefs;
				int sz = sizeof(btVector3FloatData);
				btChunk* chunk = serializer->allocate(sz,numElem);
				btVector3FloatData* memPtr = (btVector3FloatData*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					m_clusters[i]->m_framerefs[j].serializeFloat(*memPtr);
				}
				serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_framerefs[0]);
			}
			
			memPtr->m_masses = memPtr->m_numMasses ? (float*) serializer->getUniquePointer((void*)&m_clusters[i]->m_masses[0]): 0;
			if (memPtr->m_masses)
			{
				int numElem = memPtr->m_numMasses;
				int sz = sizeof(float);
				btChunk* chunk = serializer->allocate(sz,numElem);
				float* memPtr = (float*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					*memPtr = m_clusters[i]->m_masses[j];
				}
				serializer->finalizeChunk(chunk,"float",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_masses[0]);
			}

			memPtr->m_nodeIndices  = memPtr->m_numNodes ? (int*) serializer->getUniquePointer((void*) &m_clusters[i]->m_nodes) : 0;
			if (memPtr->m_nodeIndices )
			{
				int numElem = memPtr->m_numMasses;
				int sz = sizeof(int);
				btChunk* chunk = serializer->allocate(sz,numElem);
				int* memPtr = (int*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					int* indexPtr = m_nodeIndexMap.find(m_clusters[i]->m_nodes[j]);
					btAssert(indexPtr);
					*memPtr = *indexPtr;
				}
				serializer->finalizeChunk(chunk,"int",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_nodes);
			}
		}
		serializer->finalizeChunk(chunk,"SoftBodyClusterData",BT_ARRAY_CODE,(void*)m_clusters[0]);

	}
	

	
	sbd->m_numJoints = m_joints.size();
	sbd->m_joints = m_joints.size()? (btSoftBodyJointData*) serializer->getUniquePointer((void*)&m_joints[0]) : 0;

	if (sbd->m_joints)
	{
		int sz = sizeof(btSoftBodyJointData);
		int numElem = m_joints.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btSoftBodyJointData* memPtr = (btSoftBodyJointData*)chunk->m_oldPtr;

		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_jointType = (int)m_joints[i]->Type();
			m_joints[i]->m_refs[0].serializeFloat(memPtr->m_refs[0]);
			m_joints[i]->m_refs[1].serializeFloat(memPtr->m_refs[1]);
			memPtr->m_cfm = m_joints[i]->m_cfm;
			memPtr->m_erp = float(m_joints[i]->m_erp);
			memPtr->m_split = float(m_joints[i]->m_split);
			memPtr->m_delete = m_joints[i]->m_delete;
			
			for (int j=0;j<4;j++)
			{
				memPtr->m_relPosition[0].m_floats[j] = 0.f;
				memPtr->m_relPosition[1].m_floats[j] = 0.f;
			}
			memPtr->m_bodyA = 0;
			memPtr->m_bodyB = 0;
			if (m_joints[i]->m_bodies[0].m_soft)
			{
				memPtr->m_bodyAtype = BT_JOINT_SOFT_BODY_CLUSTER;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_soft);
			}
			if (m_joints[i]->m_bodies[0].m_collisionObject)
			{
				memPtr->m_bodyAtype = BT_JOINT_COLLISION_OBJECT;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_collisionObject);
			}
			if (m_joints[i]->m_bodies[0].m_rigid)
			{
				memPtr->m_bodyAtype = BT_JOINT_RIGID_BODY;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_rigid);
			}

			if (m_joints[i]->m_bodies[1].m_soft)
			{
				memPtr->m_bodyBtype = BT_JOINT_SOFT_BODY_CLUSTER;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_soft);
			}
			if (m_joints[i]->m_bodies[1].m_collisionObject)
			{
				memPtr->m_bodyBtype = BT_JOINT_COLLISION_OBJECT;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_collisionObject);
			}
			if (m_joints[i]->m_bodies[1].m_rigid)
			{
				memPtr->m_bodyBtype = BT_JOINT_RIGID_BODY;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_rigid);
			}
		}
		serializer->finalizeChunk(chunk,"btSoftBodyJointData",BT_ARRAY_CODE,(void*) &m_joints[0]);
	}


	return btSoftBodyDataName;
}